

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::SolverOptionSynonym::SolverOptionSynonym
          (SolverOptionSynonym *this,char *names,SolverOption *real)

{
  pointer in_RDX;
  undefined8 *in_RDI;
  bool in_stack_000000af;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  SolverOption *in_stack_000000c0;
  undefined1 in_stack_000000c8 [16];
  char *in_stack_ffffffffffffff68;
  SolverOption *this_00;
  char **in_stack_ffffffffffffffa0;
  CStringRef in_stack_ffffffffffffffa8;
  BasicCStringRef<char> local_50;
  pointer local_18;
  
  local_18 = in_RDX;
  ValueArrayRef::ValueArrayRef((ValueArrayRef *)&stack0xffffffffffffffd8);
  SolverOption::SolverOption
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,(ValueArrayRef)in_stack_000000c8,
             in_stack_000000af);
  *in_RDI = &PTR__SolverOptionSynonym_003a54c0;
  in_RDI[0x1a] = local_18;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b));
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_50,"Synonym for %s.");
  SolverOption::name((SolverOption *)0x2c7d7d);
  fmt::sprintf<char_const*>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = (SolverOption *)&stack0xffffffffffffffb8;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1b),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::c_str();
  SolverOption::set_description(this_00,in_stack_ffffffffffffff68);
  return;
}

Assistant:

SolverOptionSynonym(const char* names, SolverOption& real) :
    SolverOption(names, ""), real_(&real) {
    desc_ = fmt::sprintf("Synonym for %s.", real_->name());
    set_description( desc_.c_str() );
  }